

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdnewpfor.h
# Opt level: O0

uint32_t FastPForLib::SIMDNewPFor<4U,_FastPForLib::Simple16<false>_>::tryB
                   (uint32_t b,uint32_t *in,uint32_t len)

{
  uint32_t curExcept;
  uint32_t i;
  uint32_t len_local;
  uint32_t *in_local;
  uint32_t b_local;
  uint32_t local_4;
  
  if (b == 0x20) {
    local_4 = 0;
  }
  else {
    curExcept = 0;
    for (i = 0; i < len; i = i + 1) {
      if ((ulong)(1L << ((byte)b & 0x3f)) <= (ulong)in[i]) {
        curExcept = curExcept + 1;
      }
    }
    local_4 = curExcept;
  }
  return local_4;
}

Assistant:

__attribute__((pure)) uint32_t
SIMDNewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::tryB(
    uint32_t b, const uint32_t *in, uint32_t len) {
  uint32_t i;
  uint32_t curExcept;

  assert(b <= 32);

  if (b == 32)
    return 0;

  for (i = 0, curExcept = 0; i < len; i++) {
    if (in[i] >= (1ULL << b))
      curExcept++;
  }

  return curExcept;
}